

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

bool __thiscall
args::ValueReader<unsigned_long>::operator()
          (ValueReader<unsigned_long> *this,string *name,string *value,unsigned_long *destination)

{
  long lVar1;
  ostream *poVar2;
  ParseError *this_00;
  string local_340;
  ostringstream problem;
  istringstream ss;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)value,_S_in);
  std::istream::_M_extract<unsigned_long>((ulong *)&ss);
  lVar1 = std::streambuf::in_avail();
  if (lVar1 < 1) {
    std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
    return true;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&problem);
  poVar2 = std::operator<<((ostream *)&problem,"Argument \'");
  poVar2 = std::operator<<(poVar2,(string *)name);
  poVar2 = std::operator<<(poVar2,"\' received invalid value type \'");
  poVar2 = std::operator<<(poVar2,(string *)value);
  std::operator<<(poVar2,"\'");
  this_00 = (ParseError *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  ParseError::ParseError(this_00,&local_340);
  __cxa_throw(this_00,&ParseError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool operator ()(const std::string &name, const std::string &value, T &destination)
        {
            std::istringstream ss(value);
            ss >> destination;

            if (ss.rdbuf()->in_avail() > 0)
            {
#ifdef ARGS_NOEXCEPT
                return false;
#else
                std::ostringstream problem;
                problem << "Argument '" << name << "' received invalid value type '" << value << "'";
                throw ParseError(problem.str());
#endif
            }
            return true;
        }